

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DefaultDisableDeclarationSyntax::setChild
          (DefaultDisableDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00453740 + *(int *)(&DAT_00453740 + index * 4)))();
  return;
}

Assistant:

void DefaultDisableDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: defaultKeyword = child.token(); return;
        case 2: disableKeyword = child.token(); return;
        case 3: iffKeyword = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 5: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}